

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O3

EdgeData<size_t> * __thiscall
geometrycentral::surface::SurfaceMesh::getEdgeIndices
          (EdgeData<size_t> *__return_storage_ptr__,SurfaceMesh *this)

{
  size_t sVar1;
  unsigned_long *puVar2;
  pointer puVar3;
  size_t sVar4;
  unsigned_long uVar5;
  pointer puVar6;
  pointer puVar7;
  
  MeshData<geometrycentral::surface::Edge,_unsigned_long>::MeshData(__return_storage_ptr__,this);
  sVar1 = this->nEdgesFillCount;
  if (sVar1 != 0) {
    puVar6 = (this->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar7 = (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = puVar6;
    if (this->useImplicitTwinFlag != false) {
      puVar3 = puVar7;
    }
    if (*puVar3 == 0xffffffffffffffff) {
      sVar4 = 0;
      do {
        puVar6 = puVar6 + 1;
        puVar7 = puVar7 + 2;
        if (sVar1 - 1 == sVar4) {
          return __return_storage_ptr__;
        }
        puVar3 = puVar6;
        if (this->useImplicitTwinFlag != false) {
          puVar3 = puVar7;
        }
        sVar4 = sVar4 + 1;
      } while (*puVar3 == 0xffffffffffffffff);
      goto LAB_001610fd;
    }
  }
  sVar4 = 0;
LAB_001610fd:
  if (sVar4 != sVar1) {
    puVar2 = (__return_storage_ptr__->data).
             super_PlainObjectBase<Eigen::Matrix<unsigned_long,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    uVar5 = 0;
    do {
      puVar2[sVar4] = uVar5;
      uVar5 = uVar5 + 1;
      puVar6 = (this->eHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + sVar4 + 1;
      puVar7 = (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + sVar4 * 2 + 2;
      do {
        if (sVar1 - 1 == sVar4) {
          return __return_storage_ptr__;
        }
        puVar3 = puVar6;
        if ((this->useImplicitTwinFlag & 1U) != 0) {
          puVar3 = puVar7;
        }
        puVar6 = puVar6 + 1;
        puVar7 = puVar7 + 2;
        sVar4 = sVar4 + 1;
      } while (*puVar3 == 0xffffffffffffffff);
    } while (sVar1 != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

EdgeData<size_t> SurfaceMesh::getEdgeIndices() {
  EdgeData<size_t> indices(*this);
  size_t i = 0;
  for (Edge e : edges()) {
    indices[e] = i;
    i++;
  }
  return indices;
}